

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMTaskHandle INT_CMadd_periodic(CManager_conflict cm,long period,CMPollFunc func,void *client_data)

{
  periodic_task_handle p_Var1;
  void *in_RCX;
  select_list_func in_RDX;
  int in_ESI;
  CManager_conflict in_RDI;
  CMTaskHandle handle;
  CManager_conflict in_stack_000000f8;
  CMControlList in_stack_00000100;
  size_t in_stack_ffffffffffffffd0;
  CMTaskHandle local_8;
  
  local_8 = (CMTaskHandle)INT_CMmalloc(in_stack_ffffffffffffffd0);
  if (in_RDI->control_list->select_initialized == 0) {
    CM_init_select(in_stack_00000100,in_stack_000000f8);
  }
  local_8->cm = in_RDI;
  p_Var1 = (*in_RDI->control_list->add_periodic)
                     (&CMstatic_trans_svcs,&in_RDI->control_list->select_data,0,in_ESI,in_RDX,in_RDI
                      ,in_RCX);
  local_8->task = p_Var1;
  if (local_8->task == (periodic_task_handle)0x0) {
    free(local_8);
    local_8 = (CMTaskHandle)0x0;
  }
  return local_8;
}

Assistant:

extern CMTaskHandle
 INT_CMadd_periodic(CManager cm, long period, CMPollFunc func,
		    void *client_data)
 {
     CMTaskHandle handle = INT_CMmalloc(sizeof(*handle));
     if (!cm->control_list->select_initialized) {
	 CM_init_select(cm->control_list, cm);
     }
     handle->cm = cm;
     handle->task = 
	 cm->control_list->add_periodic(&CMstatic_trans_svcs,
					&cm->control_list->select_data,
					0, period, (select_list_func)func, 
					(void*)cm, client_data);
     if (handle->task == NULL) {
	 free(handle);
	 return NULL;
     }
     return handle;
 }